

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O0

string * absl::StrCat_abi_cxx11_(AlphaNum *a,AlphaNum *b)

{
  AlphaNum *x;
  Nonnull<char_*> pcVar1;
  long lVar2;
  string *in_RDI;
  char *out;
  char *begin;
  char *absl_raw_log_internal_filename;
  string death_message;
  uint64_t result_size;
  uint64_t kMaxSize;
  string *result;
  size_t in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  AlphaNum *x_00;
  Nonnull<char_*> in_stack_ffffffffffffff20;
  
  std::__cxx11::string::string((string *)in_RDI);
  AlphaNum::size((AlphaNum *)0x3c6e02);
  AlphaNum::size((AlphaNum *)0x3c6e16);
  strings_internal::STLStringResizeUninitialized<std::__cxx11::string,void>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  x = (AlphaNum *)std::__cxx11::string::operator[]((ulong)in_RDI);
  x_00 = x;
  anon_unknown_5::Append(in_stack_ffffffffffffff20,x);
  pcVar1 = anon_unknown_5::Append(in_stack_ffffffffffffff20,x_00);
  lVar2 = std::__cxx11::string::size();
  if (pcVar1 == x->digits_ + lVar2 + -0x10) {
    return in_RDI;
  }
  __assert_fail("out == begin + result.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                ,0x4d,"std::string absl::StrCat(const AlphaNum &, const AlphaNum &)");
}

Assistant:

std::string StrCat(const AlphaNum& a, const AlphaNum& b) {
  std::string result;
  // Use uint64_t to prevent size_t overflow. We assume it is not possible for
  // in memory strings to overflow a uint64_t.
  constexpr uint64_t kMaxSize = uint64_t{std::numeric_limits<size_t>::max()};
  const uint64_t result_size =
      static_cast<uint64_t>(a.size()) + static_cast<uint64_t>(b.size());
  ABSL_INTERNAL_CHECK(result_size <= kMaxSize, "size_t overflow");
  absl::strings_internal::STLStringResizeUninitialized(
      &result, static_cast<size_t>(result_size));
  char* const begin = &result[0];
  char* out = begin;
  out = Append(out, a);
  out = Append(out, b);
  assert(out == begin + result.size());
  return result;
}